

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CodeGeneratorRequest::MergeFrom
          (CodeGeneratorRequest *this,CodeGeneratorRequest *from)

{
  bool bVar1;
  LogMessage *other;
  string *value;
  UnknownFieldSet *this_00;
  UnknownFieldSet *other_00;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  CodeGeneratorRequest *local_18;
  CodeGeneratorRequest *from_local;
  CodeGeneratorRequest *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/plugin.pb.cc"
               ,0x1ad);
    local_51 = 1;
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(local_65,other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(&this->file_to_generate_,&local_18->file_to_generate_);
  RepeatedPtrField<google::protobuf::FileDescriptorProto>::MergeFrom
            (&this->proto_file_,&local_18->proto_file_);
  if (((local_18->_has_bits_[0] & 0x1fe) != 0) && (bVar1 = has_parameter(local_18), bVar1)) {
    value = parameter_abi_cxx11_(local_18);
    set_parameter(this,value);
  }
  this_00 = mutable_unknown_fields(this);
  other_00 = unknown_fields(local_18);
  UnknownFieldSet::MergeFrom(this_00,other_00);
  return;
}

Assistant:

void CodeGeneratorRequest::MergeFrom(const CodeGeneratorRequest& from) {
  GOOGLE_CHECK_NE(&from, this);
  file_to_generate_.MergeFrom(from.file_to_generate_);
  proto_file_.MergeFrom(from.proto_file_);
  if (from._has_bits_[1 / 32] & (0xffu << (1 % 32))) {
    if (from.has_parameter()) {
      set_parameter(from.parameter());
    }
  }
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}